

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.h
# Opt level: O0

Image<float,_gimage::PixelTraits<float>_> *
gimage::medianDownscaleImage<float>(Image<float,_gimage::PixelTraits<float>_> *image,int factor)

{
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> __middle;
  bool bVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  reference pvVar5;
  Image<float,_gimage::PixelTraits<float>_> *in_RSI;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  int ii;
  int kk;
  int n;
  long i;
  long k;
  int d;
  vector<float,_std::allocator<float>_> v;
  Image<float,_gimage::PixelTraits<float>_> *ret;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffed8;
  long in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_fffffffffffffef0;
  store_t_conflict in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  __normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> in_stack_ffffffffffffff00;
  int local_6c;
  int local_68;
  int local_64;
  long local_60;
  long local_58;
  int local_50;
  vector<float,_std::allocator<float>_> local_38;
  byte local_19;
  int local_18;
  int local_14;
  Image<float,_gimage::PixelTraits<float>_> *local_10;
  
  local_18 = 1;
  local_10 = in_RSI;
  piVar3 = std::max<int>(&local_18,&local_14);
  local_14 = *piVar3;
  local_19 = 0;
  Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
  Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
  Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10);
  Image<float,_gimage::PixelTraits<float>_>::Image
            ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffef0._M_current,
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),in_stack_fffffffffffffee0
             ,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  std::allocator<float>::allocator((allocator<float> *)0x1678f9);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff00._M_current,
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
             in_stack_fffffffffffffef0._M_current,
             (allocator_type *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  std::allocator<float>::~allocator((allocator<float> *)0x16792d);
  for (local_50 = 0; iVar2 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_10),
      local_50 < iVar2; local_50 = local_50 + 1) {
    for (local_58 = 0; lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10),
        local_58 < lVar4; local_58 = local_14 + local_58) {
      for (local_60 = 0; lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10),
          local_60 < lVar4; local_60 = local_14 + local_60) {
        local_64 = 0;
        local_68 = 0;
        while( true ) {
          bVar1 = false;
          if (local_68 < local_14) {
            lVar4 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_10);
            bVar1 = local_58 + local_68 < lVar4;
          }
          if (!bVar1) break;
          local_6c = 0;
          while( true ) {
            bVar1 = false;
            if (local_6c < local_14) {
              in_stack_ffffffffffffff00._M_current = (float *)(local_60 + local_6c);
              lVar4 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_10);
              bVar1 = (long)in_stack_ffffffffffffff00._M_current < lVar4;
            }
            if (!bVar1) break;
            bVar1 = Image<float,_gimage::PixelTraits<float>_>::isValid
                              ((Image<float,_gimage::PixelTraits<float>_> *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                               (long)in_stack_fffffffffffffef0._M_current,
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
            in_stack_fffffffffffffefc = CONCAT13(bVar1,(int3)in_stack_fffffffffffffefc);
            if (bVar1) {
              in_stack_fffffffffffffef8 =
                   Image<float,_gimage::PixelTraits<float>_>::get
                             (local_10,local_60 + local_6c,local_58 + local_68,local_50);
              pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                                 (&local_38,(long)local_64);
              *pvVar5 = in_stack_fffffffffffffef8;
              local_64 = local_64 + 1;
            }
            local_6c = local_6c + 1;
          }
          local_68 = local_68 + 1;
        }
        Image<float,_gimage::PixelTraits<float>_>::setInvalid
                  ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffef0._M_current
                   ,CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee0,(long)in_stack_fffffffffffffed8);
        if (0 < local_64) {
          in_stack_fffffffffffffef0._M_current = (float *)&local_38;
          std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffed8);
          std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffed8);
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee0);
          std::vector<float,_std::allocator<float>_>::begin(in_stack_fffffffffffffed8);
          __gnu_cxx::__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>::
          operator+((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                    in_stack_fffffffffffffee0);
          __middle._M_current._4_4_ = in_stack_fffffffffffffefc;
          __middle._M_current._0_4_ = in_stack_fffffffffffffef8;
          std::
          partial_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
                    (in_stack_ffffffffffffff00,__middle,in_stack_fffffffffffffef0);
          in_stack_fffffffffffffed8 =
               (vector<float,_std::allocator<float>_> *)(local_60 / (long)local_14);
          in_stack_fffffffffffffee0 = local_58 / (long)local_14;
          in_stack_fffffffffffffeec = local_50;
          pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                             (&local_38,(long)(local_64 >> 1));
          Image<float,_gimage::PixelTraits<float>_>::set
                    (in_RDI,(long)in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
                     in_stack_fffffffffffffeec,*pvVar5);
        }
      }
    }
  }
  local_19 = 1;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffef0._M_current);
  if ((local_19 & 1) == 0) {
    Image<float,_gimage::PixelTraits<float>_>::~Image
              ((Image<float,_gimage::PixelTraits<float>_> *)in_stack_fffffffffffffef0._M_current);
  }
  return in_RDI;
}

Assistant:

Image<T> medianDownscaleImage(const Image<T> &image, int factor)
{
  factor=std::max(1, factor);

  Image<T> ret((image.getWidth()+factor-1)/factor,
               (image.getHeight()+factor-1)/factor, image.getDepth());

  std::vector<T> v(factor*factor, 0);

  for (int d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k+=factor)
    {
      for (long i=0; i<image.getWidth(); i+=factor)
      {
        int n=0;

        for (int kk=0; kk<factor && k+kk<image.getHeight(); kk++)
        {
          for (int ii=0; ii<factor && i+ii<image.getWidth(); ii++)
          {
            if (image.isValid(i+ii, k+kk))
            {
              v[n]=image.get(i+ii, k+kk, d);
              n++;
            }
          }
        }

        ret.setInvalid(i/factor, k/factor, d);

        if (n > 0)
        {
          partial_sort(v.begin(), v.begin()+(n>>1), v.begin()+n);
          ret.set(i/factor, k/factor, d, v[n>>1]);
        }
      }
    }
  }

  return ret;
}